

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

NanoVDBMediumProvider *
pbrt::NanoVDBMediumProvider::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  ulong uVar2;
  Allocator alloc_00;
  string *filename_00;
  Vec3<double> *pVVar3;
  double *args_5;
  NanoVDBMediumProvider *this;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  Float temperatureScale;
  Float temperatureCutoff;
  Float LeScale;
  Bounds3f bounds;
  GridHandle<pbrt::NanoVDBBuffer> temperatureGrid;
  BBox<nanovdb::Vec3<double>,_true> bbox;
  GridHandle<pbrt::NanoVDBBuffer> densityGrid;
  string filename;
  string *in_stack_fffffffffffffc78;
  ParameterDictionary *in_stack_fffffffffffffc80;
  GridHandle<pbrt::NanoVDBBuffer> *in_stack_fffffffffffffc90;
  allocator<char> *args_4;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  Point3<float> *in_stack_fffffffffffffca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  GridHandle<pbrt::NanoVDBBuffer> *args_1;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *in_stack_fffffffffffffcc8;
  string *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  FileLoc *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  string *gridName;
  string *in_stack_fffffffffffffd60;
  Allocator in_stack_fffffffffffffd68;
  allocator<char> local_251;
  string local_250 [32];
  Float local_230;
  undefined1 local_229 [33];
  Float local_208;
  allocator<char> local_201;
  string local_200 [36];
  Float local_1dc;
  undefined8 local_1a8;
  undefined1 local_199 [97];
  undefined8 local_138;
  allocator<char> local_129;
  string local_128 [64];
  BaseBBox<nanovdb::Vec3<double>_> local_e8;
  allocator<char> local_91;
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  undefined8 local_8;
  
  local_10 = in_RDI;
  local_8 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc0,
             (char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
             (allocator<char> *)in_stack_fffffffffffffcb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc0,
             (char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
             (allocator<char> *)in_stack_fffffffffffffcb0);
  ParameterDictionary::GetOneString
            ((ParameterDictionary *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    ErrorExit((FileLoc *)in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78);
  }
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::GridHandle
            ((GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffc80);
  nanovdb::BBox<nanovdb::Vec3<double>,_true>::BBox
            ((BBox<nanovdb::Vec3<double>,_true> *)in_stack_fffffffffffffcb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc0,
             (char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
             (allocator<char> *)in_stack_fffffffffffffcb0);
  local_138 = local_8;
  readGrid<pbrt::NanoVDBBuffer>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd68);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::operator=
            ((GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffc80,
             (GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffc78);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle
            ((GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffc80);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  bVar1 = nanovdb::GridHandleBase::operator_cast_to_bool((GridHandleBase *)0x72e975);
  if (!bVar1) {
    ErrorExit<std::__cxx11::string&>
              ((FileLoc *)in_stack_fffffffffffffcc0,
               (char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
               in_stack_fffffffffffffcb0);
  }
  alloc_00.memoryResource =
       (memory_resource *)
       nanovdb::GridHandle<pbrt::NanoVDBBuffer>::grid<float>(in_stack_fffffffffffffc90);
  filename_00 = (string *)
                nanovdb::
                Grid<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>_>
                ::worldBBox((Grid<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>_>
                             *)alloc_00.memoryResource);
  local_e8.mCoord[0].mVec[0] = *(double *)filename_00;
  local_e8.mCoord[0].mVec[1] = (double)filename_00->_M_string_length;
  local_e8.mCoord[0].mVec[2] = (double)(filename_00->field_2)._M_allocated_capacity;
  local_e8.mCoord[1].mVec[0] = *(double *)((long)&filename_00->field_2 + 8);
  local_e8.mCoord[1].mVec[1] = *(double *)(filename_00 + 1);
  local_e8.mCoord[1].mVec[2] = (double)filename_00[1]._M_string_length;
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::GridHandle
            ((GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffc80);
  gridName = (string *)local_199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc0,
             (char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
             (allocator<char> *)in_stack_fffffffffffffcb0);
  local_1a8 = local_8;
  readGrid<pbrt::NanoVDBBuffer>(filename_00,gridName,in_stack_fffffffffffffd50,alloc_00);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::operator=
            ((GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffc80,
             (GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffc78);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle
            ((GridHandle<pbrt::NanoVDBBuffer> *)in_stack_fffffffffffffc80);
  std::__cxx11::string::~string((string *)(local_199 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_199);
  pVVar3 = nanovdb::BaseBBox<nanovdb::Vec3<double>_>::min(&local_e8);
  nanovdb::Vec3<double>::operator[](pVVar3,0);
  pVVar3 = nanovdb::BaseBBox<nanovdb::Vec3<double>_>::min(&local_e8);
  nanovdb::Vec3<double>::operator[](pVVar3,1);
  pVVar3 = nanovdb::BaseBBox<nanovdb::Vec3<double>_>::min(&local_e8);
  nanovdb::Vec3<double>::operator[](pVVar3,2);
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffc80,
             (float)((ulong)in_stack_fffffffffffffc78 >> 0x20),SUB84(in_stack_fffffffffffffc78,0),
             0.0);
  pVVar3 = nanovdb::BaseBBox<nanovdb::Vec3<double>_>::max(&local_e8);
  nanovdb::Vec3<double>::operator[](pVVar3,0);
  pVVar3 = nanovdb::BaseBBox<nanovdb::Vec3<double>_>::max(&local_e8);
  nanovdb::Vec3<double>::operator[](pVVar3,1);
  pVVar3 = nanovdb::BaseBBox<nanovdb::Vec3<double>_>::max(&local_e8);
  args_5 = nanovdb::Vec3<double>::operator[](pVVar3,2);
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffc80,
             (float)((ulong)in_stack_fffffffffffffc78 >> 0x20),SUB84(in_stack_fffffffffffffc78,0),
             0.0);
  Bounds3<float>::Bounds3
            ((Bounds3<float> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (Point3<float> *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
  this_00 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
             (allocator<char> *)in_stack_fffffffffffffcb0);
  FVar4 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,0.0);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  args_1 = (GridHandle<pbrt::NanoVDBBuffer> *)local_229;
  local_1dc = FVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)CONCAT44(FVar4,in_stack_fffffffffffffcb8),(allocator<char> *)args_1);
  FVar5 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,0.0);
  std::__cxx11::string::~string((string *)(local_229 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_229);
  args_4 = &local_251;
  local_208 = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)CONCAT44(FVar4,in_stack_fffffffffffffcb8),(allocator<char> *)args_1);
  FVar6 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,0.0);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  local_230 = FVar6;
  this = pstd::pmr::polymorphic_allocator<std::byte>::
         new_object<pbrt::NanoVDBMediumProvider,pbrt::Bounds3<float>&,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,float&,float&,float&>
                   ((polymorphic_allocator<std::byte> *)this_00,
                    (Bounds3<float> *)CONCAT44(FVar4,in_stack_fffffffffffffcb8),args_1,
                    (GridHandle<pbrt::NanoVDBBuffer> *)local_10,
                    (float *)CONCAT44(FVar5,in_stack_fffffffffffffca0),(float *)args_4,
                    (float *)args_5);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle((GridHandle<pbrt::NanoVDBBuffer> *)this);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle((GridHandle<pbrt::NanoVDBBuffer> *)this);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

NanoVDBMediumProvider *NanoVDBMediumProvider::Create(
    const ParameterDictionary &parameters, const FileLoc *loc, Allocator alloc) {
    std::string filename = parameters.GetOneString("filename", "");
    if (filename.empty())
        ErrorExit(loc, "Must supply \"filename\" to \"nanovdb\" medium.");

    nanovdb::GridHandle<NanoVDBBuffer> densityGrid;
    nanovdb::BBox<nanovdb::Vec3R> bbox;
    densityGrid = readGrid<NanoVDBBuffer>(filename, "density", loc, alloc);
    if (!densityGrid)
        ErrorExit(loc, "%s: didn't find \"density\" grid.", filename);

    bbox = densityGrid.grid<float>()->worldBBox();

    nanovdb::GridHandle<NanoVDBBuffer> temperatureGrid;
    temperatureGrid = readGrid<NanoVDBBuffer>(filename, "temperature", loc, alloc);

    Bounds3f bounds(Point3f(bbox.min()[0], bbox.min()[1], bbox.min()[2]),
                    Point3f(bbox.max()[0], bbox.max()[1], bbox.max()[2]));

    Float LeScale = parameters.GetOneFloat("LeScale", 1.f);
    Float temperatureCutoff = parameters.GetOneFloat("temperaturecutoff", 0.f);
    Float temperatureScale = parameters.GetOneFloat("temperaturescale", 1.f);

    return alloc.new_object<NanoVDBMediumProvider>(bounds, std::move(densityGrid),
                                                   std::move(temperatureGrid), LeScale,
                                                   temperatureCutoff, temperatureScale);
}